

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall cmGraphVizWriter::WriteTargetDependersFiles(cmGraphVizWriter *this,string *fileName)

{
  bool bVar1;
  TargetType targetType;
  ostream *poVar2;
  _Base_ptr p_Var3;
  cmGraphVizWriter *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  string currentFilename;
  cmGeneratedFileStream str;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  string local_298;
  undefined1 local_278 [584];
  
  if (this->GenerateDependers == true) {
    CollectTargetsAndLibs(this);
    for (p_Var3 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      if (*(cmGeneratorTarget **)(p_Var3 + 2) != (cmGeneratorTarget *)0x0) {
        targetType = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var3 + 2));
        bVar1 = GenerateForTargetType(this,targetType);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_298,(string *)fileName);
          std::__cxx11::string::append((char *)&local_298);
          std::__cxx11::string::append((string *)&local_298);
          std::__cxx11::string::append((char *)&local_298);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_278,&local_298,false,None);
          if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) != 0)
          {
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
            std::__cxx11::string::~string((string *)&local_298);
            return;
          }
          local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_2c8._M_impl.super__Rb_tree_header._M_header;
          local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_2f8._M_impl.super__Rb_tree_header._M_header;
          local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
          local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
          poVar2 = std::operator<<((ostream *)&std::cout,"Writing ");
          poVar2 = std::operator<<(poVar2,(string *)&local_298);
          poVar2 = std::operator<<(poVar2,"...");
          std::endl<char,std::char_traits<char>>(poVar2);
          WriteHeader(this,(cmGeneratedFileStream *)local_278);
          this_00 = this;
          WriteDependerConnections
                    (this,(string *)(p_Var3 + 1),
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2f8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2c8,(cmGeneratedFileStream *)local_278);
          WriteFooter(this_00,(cmGeneratedFileStream *)local_278);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_2f8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_2c8);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
          std::__cxx11::string::~string((string *)&local_298);
        }
      }
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteTargetDependersFiles(const std::string& fileName)
{
  if (!this->GenerateDependers) {
    return;
  }

  this->CollectTargetsAndLibs();

  for (auto const& ptr : this->TargetPtrs) {
    if (ptr.second == nullptr) {
      continue;
    }

    if (!this->GenerateForTargetType(ptr.second->GetType())) {
      continue;
    }

    std::string currentFilename = fileName;
    currentFilename += ".";
    currentFilename += ptr.first;
    currentFilename += ".dependers";

    cmGeneratedFileStream str(currentFilename);
    if (!str) {
      return;
    }

    std::set<std::string> insertedConnections;
    std::set<std::string> insertedNodes;

    std::cout << "Writing " << currentFilename << "..." << std::endl;
    this->WriteHeader(str);

    this->WriteDependerConnections(ptr.first, insertedNodes,
                                   insertedConnections, str);

    this->WriteFooter(str);
  }
}